

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O0

void bsp_set_tagsize(bsp_size_t *tag_nbytes)

{
  bool bVar1;
  size_t sVar2;
  bsp_size_t *tag_nbytes_local;
  
  if ((s_spmd == (Spmd *)0x0) || (bVar1 = bsplib::Spmd::closed(s_spmd), bVar1)) {
    bsp_abort("bsp_set_tagsize: can only be called within SPMD section\n");
  }
  if (tag_nbytes == (bsp_size_t *)0x0) {
    bsp_abort("bsp_set_tagsize: NULL ptr as argument is now allowed\n");
  }
  if (*tag_nbytes < 0) {
    bsp_abort("bsp_set_tagsize: Tag size may not be negative\n");
  }
  sVar2 = bsplib::Bsmp::set_tag_size(s_bsmp,(long)*tag_nbytes);
  *tag_nbytes = (bsp_size_t)sVar2;
  return;
}

Assistant:

void bsp_set_tagsize( bsp_size_t * tag_nbytes )
{
    if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_set_tagsize: can only be called within SPMD section\n");

    if (tag_nbytes == NULL)
        bsp_abort("bsp_set_tagsize: NULL ptr as argument is now allowed\n");

    if (*tag_nbytes < 0 )
        bsp_abort("bsp_set_tagsize: Tag size may not be negative\n");

    *tag_nbytes = static_cast<bsp_size_t>(s_bsmp->set_tag_size( *tag_nbytes ));
}